

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cc
# Opt level: O0

Object * __thiscall xt::Object::operator=(Object *this,Object *o)

{
  Object *o_local;
  Object *this_local;
  
  this->type = o->type;
  if (this->type == Boolean) {
    (this->field_2).ch = (o->field_2).ch & 1;
  }
  if (this->type == Number) {
    (this->field_2).number = (o->field_2).number;
  }
  if (this->type == Char) {
    (this->field_2).b = (o->field_2).b;
  }
  if (this->type == Pointer) {
    std::shared_ptr<void>::shared_ptr(&(this->field_2).ptr,&(o->field_2).ptr);
  }
  this->typeinfo = o->typeinfo;
  return this;
}

Assistant:

Object& Object::operator=(const Object& o) {
	type = o.type;
	if (type == Type::Boolean) b = o.b;
	if (type == Type::Number) number = o.number;
	if (type == Type::Char) ch = o.ch;
	if (type == Type::Pointer) new (&ptr) std::shared_ptr<void>(o.ptr);
	typeinfo = o.typeinfo;
	return *this;
}